

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

bool __thiscall
jrtplib::RTPExternalTransmitter::ComesFromThisTransmitter
          (RTPExternalTransmitter *this,RTPAddress *addr)

{
  byte bVar1;
  bool local_19;
  bool value;
  RTPAddress *addr_local;
  RTPExternalTransmitter *this_local;
  
  local_19 = false;
  if (this->sender != (RTPExternalSender *)0x0) {
    bVar1 = (**(code **)(*(long *)this->sender + 0x20))(this->sender,addr);
    local_19 = (bool)(bVar1 & 1);
  }
  return local_19;
}

Assistant:

bool RTPExternalTransmitter::ComesFromThisTransmitter(const RTPAddress *addr)
{
	MAINMUTEX_LOCK
	bool value = false;
	if (sender)
		value = sender->ComesFromThisSender(addr);
	MAINMUTEX_UNLOCK
	return value;
}